

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.c
# Opt level: O3

void av1_tokenize_sb_vartx
               (AV1_COMP *cpi,ThreadData_conflict *td,RUN_TYPE dry_run,BLOCK_SIZE bsize,int *rate,
               uint8_t allow_update_cdf)

{
  BLOCK_SIZE plane_bsize;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  uint blk_col;
  uint blk_row;
  uint num_planes;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  byte bVar15;
  uint uVar16;
  int block;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  bool bVar20;
  uint local_b4;
  uint local_ac;
  tokenize_b_args arg;
  
  if (((td->mb).e_mbd.mi_row < (cpi->common).mi_params.mi_rows) &&
     ((td->mb).e_mbd.mi_col < (cpi->common).mi_params.mi_cols)) {
    bVar20 = ((cpi->common).seq_params)->monochrome == '\0';
    num_planes = bVar20 + 1 + (uint)bVar20;
    arg.this_rate = 0;
    arg.cpi = cpi;
    arg.td = td;
    arg.allow_update_cdf = allow_update_cdf;
    arg.dry_run = dry_run;
    if ((*(td->mb).e_mbd.mi)->skip_txfm == '\0') {
      uVar17 = 0;
      do {
        if ((uVar17 != 0) && ((td->mb).e_mbd.is_chroma_ref != true)) break;
        lVar12 = (long)(td->mb).e_mbd.plane[uVar17].subsampling_x;
        lVar13 = (long)(td->mb).e_mbd.plane[uVar17].subsampling_y;
        plane_bsize = av1_ss_size_lookup[bsize][lVar12][lVar13];
        uVar19 = 0;
        if ((td->mb).e_mbd.lossless[*(ushort *)&(*(td->mb).e_mbd.mi)->field_0xa7 & 7] == 0) {
          bVar1 = ""[plane_bsize];
          if (uVar17 == 0) {
LAB_00233efd:
            bVar15 = bVar1;
          }
          else if (bVar1 < 0x11) {
            bVar15 = 3;
            if ((1 < bVar1 - 0xb) && (bVar1 != 4)) goto LAB_00233efd;
          }
          else if (bVar1 == 0x11) {
            bVar15 = 9;
          }
          else {
            if (bVar1 != 0x12) goto LAB_00233efd;
            bVar15 = 10;
          }
          uVar19 = (ulong)bVar15;
        }
        bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                [plane_bsize];
        bVar15 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [plane_bsize];
        bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                [txsize_to_bsize[uVar19]];
        bVar3 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                [txsize_to_bsize[uVar19]];
        uVar14 = (ulong)(uint)((int)uVar19 << 2);
        iVar7 = *(int *)((long)tx_size_high_unit + uVar14);
        iVar8 = *(int *)((long)tx_size_wide_unit + uVar14);
        bVar4 = *(byte *)(lVar13 + lVar12 * 2 + 0x518350);
        bVar5 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bVar4];
        if (bVar1 < "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [bVar4]) {
          bVar5 = bVar1;
        }
        bVar6 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[bVar4];
        if (bVar15 < "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [bVar4]) {
          bVar6 = bVar15;
        }
        block = 0;
        uVar18 = 0;
        do {
          uVar9 = bVar6 + uVar18;
          uVar16 = (uint)bVar15;
          if (uVar9 < bVar15) {
            uVar16 = uVar9;
          }
          uVar10 = 0;
          do {
            local_ac = (uint)bVar1;
            uVar11 = bVar5 + uVar10;
            blk_row = uVar18;
            if (uVar11 < local_ac) {
              local_ac = uVar11;
            }
            for (; blk_col = uVar10, blk_row < uVar16; blk_row = blk_row + bVar3) {
              for (; blk_col < local_ac; blk_col = blk_col + bVar2) {
                tokenize_vartx(td,(TX_SIZE)uVar19,plane_bsize,blk_row,blk_col,block,(int)uVar17,&arg
                              );
                block = block + iVar7 * iVar8;
              }
            }
            local_ac = (uint)bVar1;
            local_b4 = (uint)bVar15;
            uVar10 = uVar11;
          } while (uVar11 < local_ac);
          uVar18 = uVar9;
        } while (uVar9 < local_b4);
        uVar17 = uVar17 + 1;
      } while (uVar17 != num_planes);
      if (rate != (int *)0x0) {
        *rate = *rate + arg.this_rate;
      }
    }
    else {
      av1_reset_entropy_context(&(td->mb).e_mbd,bsize,num_planes);
    }
  }
  return;
}

Assistant:

void av1_tokenize_sb_vartx(const AV1_COMP *cpi, ThreadData *td,
                           RUN_TYPE dry_run, BLOCK_SIZE bsize, int *rate,
                           uint8_t allow_update_cdf) {
  assert(bsize < BLOCK_SIZES_ALL);
  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  if (mi_row >= cm->mi_params.mi_rows || mi_col >= cm->mi_params.mi_cols)
    return;

  const int num_planes = av1_num_planes(cm);
  MB_MODE_INFO *const mbmi = xd->mi[0];
  struct tokenize_b_args arg = { cpi, td, 0, allow_update_cdf, dry_run };

  if (mbmi->skip_txfm) {
    av1_reset_entropy_context(xd, bsize, num_planes);
    return;
  }

  for (int plane = 0; plane < num_planes; ++plane) {
    if (plane && !xd->is_chroma_ref) break;
    const struct macroblockd_plane *const pd = &xd->plane[plane];
    const int ss_x = pd->subsampling_x;
    const int ss_y = pd->subsampling_y;
    const BLOCK_SIZE plane_bsize = get_plane_block_size(bsize, ss_x, ss_y);
    assert(plane_bsize < BLOCK_SIZES_ALL);
    const int mi_width = mi_size_wide[plane_bsize];
    const int mi_height = mi_size_high[plane_bsize];
    const TX_SIZE max_tx_size = get_vartx_max_txsize(xd, plane_bsize, plane);
    const BLOCK_SIZE txb_size = txsize_to_bsize[max_tx_size];
    const int bw = mi_size_wide[txb_size];
    const int bh = mi_size_high[txb_size];
    int block = 0;
    const int step =
        tx_size_wide_unit[max_tx_size] * tx_size_high_unit[max_tx_size];

    const BLOCK_SIZE max_unit_bsize =
        get_plane_block_size(BLOCK_64X64, ss_x, ss_y);
    int mu_blocks_wide = mi_size_wide[max_unit_bsize];
    int mu_blocks_high = mi_size_high[max_unit_bsize];

    mu_blocks_wide = AOMMIN(mi_width, mu_blocks_wide);
    mu_blocks_high = AOMMIN(mi_height, mu_blocks_high);

    for (int idy = 0; idy < mi_height; idy += mu_blocks_high) {
      for (int idx = 0; idx < mi_width; idx += mu_blocks_wide) {
        const int unit_height = AOMMIN(mu_blocks_high + idy, mi_height);
        const int unit_width = AOMMIN(mu_blocks_wide + idx, mi_width);
        for (int blk_row = idy; blk_row < unit_height; blk_row += bh) {
          for (int blk_col = idx; blk_col < unit_width; blk_col += bw) {
            tokenize_vartx(td, max_tx_size, plane_bsize, blk_row, blk_col,
                           block, plane, &arg);
            block += step;
          }
        }
      }
    }
  }
  if (rate) *rate += arg.this_rate;
}